

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::
basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::write_string_value
          (basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_view_type *value,string_type *str)

{
  size_t __n;
  char *s;
  bool bVar1;
  void *pvVar2;
  
  __n = value->_M_len;
  s = value->_M_str;
  if (this->quote_style_ - 1 < 2) {
LAB_00325fbd:
    std::__cxx11::string::push_back((char)str);
    bVar1 = true;
  }
  else {
    if ((this->quote_style_ == minimal) && (__n != 0)) {
      pvVar2 = memchr(s,(int)this->field_delimiter_,__n);
      if (pvVar2 != (void *)0x0) goto LAB_00325fbd;
      if (__n != 0) {
        pvVar2 = memchr(s,(int)this->quote_char_,__n);
        if (pvVar2 != (void *)0x0) goto LAB_00325fbd;
      }
    }
    bVar1 = false;
  }
  escape_string(this,s,__n,this->quote_char_,this->quote_escape_char_,str);
  if (bVar1) {
    std::__cxx11::string::push_back((char)str);
    return;
  }
  return;
}

Assistant:

void write_string_value(const string_view_type& value, string_type& str)
    {
        const char* s = value.data();
        const std::size_t length = value.length();
        
        bool quote = false;
        if (quote_style_ == quote_style_kind::all || quote_style_ == quote_style_kind::nonnumeric ||
            (quote_style_ == quote_style_kind::minimal &&
            (std::char_traits<CharT>::find(s, length, field_delimiter_) != nullptr || std::char_traits<CharT>::find(s, length, quote_char_) != nullptr)))
        {
            quote = true;
            str.push_back(quote_char_);
        }
        escape_string(s, length, quote_char_, quote_escape_char_, str);
        if (quote)
        {
            str.push_back(quote_char_);
        }
    }